

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_types.h
# Opt level: O0

void __thiscall Clasp::JumpStats::update(JumpStats *this,uint32 dl,uint32 uipLevel,uint32 bLevel)

{
  uint *puVar1;
  uint in_ECX;
  uint in_EDX;
  int in_ESI;
  long *in_RDI;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  uint local_10;
  int local_c;
  
  *in_RDI = *in_RDI + 1;
  in_RDI[2] = (ulong)(in_ESI - in_EDX) + in_RDI[2];
  local_18 = in_ESI - in_EDX;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  puVar1 = std::max<unsigned_int>((uint *)(in_RDI + 4),&local_18);
  *(uint *)(in_RDI + 4) = *puVar1;
  if (local_10 < local_14) {
    in_RDI[1] = in_RDI[1] + 1;
    in_RDI[3] = (ulong)(local_14 - local_10) + in_RDI[3];
    local_1c = local_c - local_14;
    puVar1 = std::max<unsigned_int>((uint *)((long)in_RDI + 0x24),&local_1c);
    *(uint *)((long)in_RDI + 0x24) = *puVar1;
    local_20 = local_14 - local_10;
    puVar1 = std::max<unsigned_int>((uint *)(in_RDI + 5),&local_20);
    *(uint *)(in_RDI + 5) = *puVar1;
  }
  else {
    *(int *)((long)in_RDI + 0x24) = (int)in_RDI[4];
  }
  return;
}

Assistant:

void update(uint32 dl, uint32 uipLevel, uint32 bLevel) {
		++jumps;
		jumpSum += dl - uipLevel;
		maxJump = std::max(maxJump, dl - uipLevel);
		if (uipLevel < bLevel) {
			++bounded;
			boundSum += bLevel - uipLevel;
			maxJumpEx = std::max(maxJumpEx, dl - bLevel);
			maxBound = std::max(maxBound, bLevel - uipLevel);
		}
		else { maxJumpEx = maxJump; }
	}